

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O1

void __thiscall
tinygltf::AnimationChannel::AnimationChannel(AnimationChannel *this,AnimationChannel *param_1)

{
  pointer pcVar1;
  int iVar2;
  
  iVar2 = param_1->target_node;
  this->sampler = param_1->sampler;
  this->target_node = iVar2;
  (this->target_path)._M_dataplus._M_p = (pointer)&(this->target_path).field_2;
  pcVar1 = (param_1->target_path)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->target_path,pcVar1,pcVar1 + (param_1->target_path)._M_string_length);
  Value::Value(&this->extras,&param_1->extras);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::_Rb_tree(&(this->extensions)._M_t,&(param_1->extensions)._M_t);
  Value::Value(&this->target_extras,&param_1->target_extras);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::_Rb_tree(&(this->target_extensions)._M_t,&(param_1->target_extensions)._M_t);
  (this->extras_json_string)._M_dataplus._M_p = (pointer)&(this->extras_json_string).field_2;
  pcVar1 = (param_1->extras_json_string)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->extras_json_string,pcVar1,
             pcVar1 + (param_1->extras_json_string)._M_string_length);
  (this->extensions_json_string)._M_dataplus._M_p = (pointer)&(this->extensions_json_string).field_2
  ;
  pcVar1 = (param_1->extensions_json_string)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->extensions_json_string,pcVar1,
             pcVar1 + (param_1->extensions_json_string)._M_string_length);
  (this->target_extras_json_string)._M_dataplus._M_p =
       (pointer)&(this->target_extras_json_string).field_2;
  pcVar1 = (param_1->target_extras_json_string)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->target_extras_json_string,pcVar1,
             pcVar1 + (param_1->target_extras_json_string)._M_string_length);
  (this->target_extensions_json_string)._M_dataplus._M_p =
       (pointer)&(this->target_extensions_json_string).field_2;
  pcVar1 = (param_1->target_extensions_json_string)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->target_extensions_json_string,pcVar1,
             pcVar1 + (param_1->target_extensions_json_string)._M_string_length);
  return;
}

Assistant:

AnimationChannel() = default;